

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonAppendObjectPathElement(JsonString *pStr,JsonNode *pNode)

{
  bool bVar1;
  JsonNode *local_28;
  char *z;
  int nn;
  int jj;
  JsonNode *pNode_local;
  JsonString *pStr_local;
  
  local_28 = (pNode->u).pPatch;
  z._0_4_ = pNode->n;
  if ((2 < (int)(u32)z) && ((""[local_28->jnFlags] & 2) != 0)) {
    z._4_4_ = 2;
    while( true ) {
      bVar1 = false;
      if (z._4_4_ < (int)((u32)z - 1)) {
        bVar1 = (""[(&local_28->eType)[z._4_4_]] & 6) != 0;
      }
      if (!bVar1) break;
      z._4_4_ = z._4_4_ + 1;
    }
    if (z._4_4_ == (u32)z - 1) {
      local_28 = (JsonNode *)&local_28->jnFlags;
      z._0_4_ = (u32)z - 2;
    }
  }
  jsonPrintf((u32)z + 2,pStr,".%.*s",(ulong)(u32)z,local_28);
  return;
}

Assistant:

static void jsonAppendObjectPathElement(
  JsonString *pStr,
  JsonNode *pNode
){
  int jj, nn;
  const char *z;
  assert( pNode->eType==JSON_STRING );
  assert( pNode->jnFlags & JNODE_LABEL );
  assert( pNode->eU==1 );
  z = pNode->u.zJContent;
  nn = pNode->n;
  assert( nn>=2 );
  assert( z[0]=='"' );
  assert( z[nn-1]=='"' );
  if( nn>2 && sqlite3Isalpha(z[1]) ){
    for(jj=2; jj<nn-1 && sqlite3Isalnum(z[jj]); jj++){}
    if( jj==nn-1 ){
      z++;
      nn -= 2;
    }
  }
  jsonPrintf(nn+2, pStr, ".%.*s", nn, z);
}